

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimization-options.h
# Opt level: O2

void __thiscall
wasm::OptimizationOptions::OptimizationOptions
          (OptimizationOptions *this,string *command,string *description)

{
  string *psVar1;
  undefined8 uVar2;
  _Any_data local_f48;
  code *local_f38;
  code *local_f30;
  _Any_data local_f28;
  code *local_f18;
  code *local_f10;
  _Any_data local_f08;
  code *local_ef8;
  code *local_ef0;
  _Any_data local_ee8;
  code *local_ed8;
  code *local_ed0;
  _Any_data local_ec8;
  code *local_eb8;
  code *local_eb0;
  _Any_data local_ea8;
  code *local_e98;
  code *local_e90;
  _Any_data local_e88;
  code *local_e78;
  code *local_e70;
  _Any_data local_e68;
  code *local_e58;
  code *local_e50;
  _Any_data local_e48;
  code *local_e38;
  code *local_e30;
  _Any_data local_e28;
  code *local_e18;
  code *local_e10;
  _Any_data local_e08;
  code *local_df8;
  code *local_df0;
  _Any_data local_de8;
  code *local_dd8;
  code *local_dd0;
  _Any_data local_dc8;
  code *local_db8;
  code *local_db0;
  _Any_data local_da8;
  code *local_d98;
  code *local_d90;
  _Any_data local_d88;
  code *local_d78;
  code *local_d70;
  _Any_data local_d68;
  code *local_d58;
  code *local_d50;
  _Any_data local_d48;
  code *local_d38;
  code *local_d30;
  _Any_data local_d28;
  code *local_d18;
  code *local_d10;
  _Any_data local_d08;
  code *local_cf8;
  code *local_cf0;
  _Any_data local_ce8;
  code *local_cd8;
  code *local_cd0;
  string local_cc8 [32];
  string local_ca8 [32];
  _Any_data local_c88;
  code *local_c78;
  code *local_c70;
  string local_c68 [32];
  string local_c48 [32];
  string local_c28 [32];
  string local_c08 [32];
  string local_be8 [32];
  string local_bc8 [32];
  string local_ba8 [32];
  string local_b88 [32];
  string local_b68 [32];
  string local_b48 [32];
  string local_b28 [32];
  string local_b08 [32];
  string local_ae8 [32];
  string local_ac8 [32];
  string local_aa8 [32];
  string local_a88 [32];
  string local_a68 [32];
  string local_a48 [32];
  string local_a28 [32];
  string local_a08 [32];
  string local_9e8 [32];
  string local_9c8 [32];
  string local_9a8 [32];
  string local_988 [32];
  string local_968 [32];
  string local_948 [32];
  string local_928 [32];
  string local_908 [32];
  string local_8e8 [32];
  string local_8c8 [32];
  string local_8a8 [32];
  string local_888 [32];
  string local_868 [32];
  string local_848 [32];
  string local_828 [32];
  string local_808 [32];
  string local_7e8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7a8;
  string local_788;
  string local_768 [32];
  string local_748 [32];
  string local_728 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_708;
  string local_6e8;
  string local_6c8 [32];
  string local_6a8 [32];
  string local_688 [32];
  string local_668 [32];
  string local_648 [32];
  string local_628 [32];
  string local_608 [32];
  string local_5e8 [32];
  string local_5c8 [32];
  string local_5a8 [32];
  string local_588 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_568;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_548;
  string local_528;
  string local_508 [32];
  string local_4e8 [32];
  string local_4c8 [32];
  string local_4a8 [32];
  string local_488 [32];
  string local_468 [32];
  string local_448 [32];
  string local_428 [32];
  string local_408 [32];
  string local_3e8 [32];
  string local_3c8 [32];
  string local_3a8 [32];
  string local_388 [32];
  string local_368 [32];
  string local_348 [32];
  string local_328 [32];
  string local_308 [32];
  string local_2e8 [32];
  string local_2c8 [32];
  string local_2a8 [32];
  string local_288 [32];
  string local_268 [32];
  string local_248 [32];
  string local_228 [32];
  string local_208 [32];
  string local_1e8 [32];
  string local_1c8 [32];
  _Any_data local_1a8;
  code *local_198;
  code *local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  string local_148 [32];
  string local_128 [32];
  _Function_base local_108;
  undefined1 local_e8 [40];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_98;
  allocator<char> local_8d;
  allocator<char> local_8c;
  allocator<char> local_8b;
  allocator<char> local_8a;
  allocator<char> local_89;
  allocator<char> local_88;
  allocator<char> local_87;
  allocator<char> local_86;
  allocator<char> local_85;
  allocator<char> local_84;
  allocator<char> local_83;
  allocator<char> local_82;
  allocator<char> local_81;
  allocator<char> local_80;
  allocator<char> local_7f;
  allocator<char> local_7e;
  allocator<char> local_7d;
  allocator<char> local_7c;
  allocator<char> local_7b;
  allocator<char> local_7a;
  allocator<char> local_79;
  allocator<char> local_78;
  allocator<char> local_77;
  allocator<char> local_76;
  allocator<char> local_75;
  allocator<char> local_74;
  allocator<char> local_73;
  allocator<char> local_72;
  allocator<char> local_71;
  allocator<char> local_70;
  allocator<char> local_6f;
  allocator<char> local_6e;
  allocator<char> local_6d;
  allocator<char> local_6c;
  allocator<char> local_6b;
  allocator<char> local_6a;
  allocator<char> local_69;
  allocator<char> local_68;
  allocator<char> local_67;
  allocator<char> local_66;
  allocator<char> local_65;
  allocator<char> local_64;
  allocator<char> local_63;
  allocator<char> local_62;
  allocator<char> local_61;
  allocator<char> local_60;
  allocator<char> local_5f;
  allocator<char> local_5e;
  allocator<char> local_5d;
  allocator<char> local_5c;
  allocator<char> local_5b;
  allocator<char> local_5a;
  allocator<char> local_59;
  allocator<char> local_58;
  allocator<char> local_57;
  allocator<char> local_56;
  allocator<char> local_55;
  allocator<char> local_54;
  allocator<char> local_53;
  allocator<char> local_52;
  allocator<char> local_51;
  allocator<char> local_50;
  allocator<char> local_4f;
  allocator<char> local_4e;
  allocator<char> local_4d;
  allocator<char> local_4c;
  allocator<char> local_4b;
  allocator<char> local_4a;
  allocator<char> local_49;
  allocator<char> local_48;
  allocator<char> local_47;
  allocator<char> local_46;
  allocator<char> local_45;
  allocator<char> local_44;
  allocator<char> local_43;
  allocator<char> local_42;
  allocator<char> local_41;
  allocator<char> local_40;
  allocator<char> local_3f;
  allocator<char> local_3e;
  allocator<char> local_3d;
  allocator<char> local_3c;
  allocator<char> local_3b;
  allocator<char> local_3a;
  allocator<char> local_39;
  OptimizationOptions *local_38;
  
  ToolOptions::ToolOptions(&this->super_ToolOptions,command,description);
  (this->passes).
  super__Vector_base<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->passes).
  super__Vector_base<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->passes).
  super__Vector_base<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38 = this;
  std::__cxx11::string::string<std::allocator<char>>((string *)local_e8,"",&local_8d);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_188,"-O",&local_8c);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_168,"execute default optimization passes (equivalent to -Os)",
             &local_8b);
  std::__cxx11::string::string<std::allocator<char>>(local_148,"Optimization options",&local_8a);
  local_1a8._8_8_ = 0;
  local_1a8._M_unused._M_function_pointer = (_func_void *)local_38;
  local_190 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/optimization-options.h:77:9)>
              ::_M_invoke;
  local_198 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/optimization-options.h:77:9)>
              ::_M_manager;
  psVar1 = (string *)
           ::wasm::Options::add
                     ((string *)local_38,(string *)local_e8,(string *)&local_188,
                      (string *)&local_168,(Arguments)local_148,(function *)0x0,SUB81(&local_1a8,0))
  ;
  std::__cxx11::string::string<std::allocator<char>>(local_128,"",&local_89);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,"-O0",&local_88);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,"execute no optimization passes",&local_87);
  std::__cxx11::string::string<std::allocator<char>>(local_1e8,"Optimization options",&local_86);
  local_c88._8_8_ = 0;
  local_c88._M_unused._M_object = local_38;
  local_c70 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/optimization-options.h:90:12)>
              ::_M_invoke;
  local_c78 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/optimization-options.h:90:12)>
              ::_M_manager;
  psVar1 = (string *)
           ::wasm::Options::add
                     (psVar1,local_128,(string *)&local_108,(string *)&local_b8,(Arguments)local_1e8
                      ,(function *)0x0,SUB81(&local_c88,0));
  std::__cxx11::string::string<std::allocator<char>>(local_1c8,"",&local_85);
  std::__cxx11::string::string<std::allocator<char>>(local_c68,"-O1",&local_84);
  std::__cxx11::string::string<std::allocator<char>>
            (local_c48,
             "execute -O1 optimization passes (quick&useful opts, useful for iteration builds)",
             &local_83);
  std::__cxx11::string::string<std::allocator<char>>(local_c28,"Optimization options",&local_82);
  local_f48._8_8_ = 0;
  local_f48._M_unused._M_object = local_38;
  local_f30 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/optimization-options.h:100:12)>
              ::_M_invoke;
  local_f38 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/optimization-options.h:100:12)>
              ::_M_manager;
  psVar1 = (string *)
           ::wasm::Options::add
                     (psVar1,local_1c8,local_c68,local_c48,(Arguments)local_c28,(function *)0x0,
                      SUB81(&local_f48,0));
  std::__cxx11::string::string<std::allocator<char>>(local_c08,"",&local_81);
  std::__cxx11::string::string<std::allocator<char>>(local_be8,"-O2",&local_80);
  std::__cxx11::string::string<std::allocator<char>>
            (local_bc8,"execute -O2 optimization passes (most opts, generally gets most perf)",
             &local_7f);
  std::__cxx11::string::string<std::allocator<char>>(local_ba8,"Optimization options",&local_7e);
  local_f28._8_8_ = 0;
  local_f28._M_unused._M_object = local_38;
  local_f10 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/optimization-options.h:111:9)>
              ::_M_invoke;
  local_f18 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/optimization-options.h:111:9)>
              ::_M_manager;
  psVar1 = (string *)
           ::wasm::Options::add
                     (psVar1,local_c08,local_be8,local_bc8,(Arguments)local_ba8,(function *)0x0,
                      SUB81(&local_f28,0));
  std::__cxx11::string::string<std::allocator<char>>(local_b88,"",&local_7d);
  std::__cxx11::string::string<std::allocator<char>>(local_b68,"-O3",&local_7c);
  std::__cxx11::string::string<std::allocator<char>>
            (local_b48,
             "execute -O3 optimization passes (spends potentially a lot of time optimizing)",
             &local_7b);
  std::__cxx11::string::string<std::allocator<char>>(local_b28,"Optimization options",&local_7a);
  local_f08._8_8_ = 0;
  local_f08._M_unused._M_object = local_38;
  local_ef0 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/optimization-options.h:122:12)>
              ::_M_invoke;
  local_ef8 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/optimization-options.h:122:12)>
              ::_M_manager;
  psVar1 = (string *)
           ::wasm::Options::add
                     (psVar1,local_b88,local_b68,local_b48,(Arguments)local_b28,(function *)0x0,
                      SUB81(&local_f08,0));
  std::__cxx11::string::string<std::allocator<char>>(local_b08,"",&local_79);
  std::__cxx11::string::string<std::allocator<char>>(local_ae8,"-O4",&local_78);
  std::__cxx11::string::string<std::allocator<char>>
            (local_ac8,
             "execute -O4 optimization passes (also flatten the IR, which can take a lot more time and memory, but is useful on more nested / complex / less-optimized input)"
             ,&local_77);
  std::__cxx11::string::string<std::allocator<char>>(local_aa8,"Optimization options",&local_76);
  local_ee8._8_8_ = 0;
  local_ee8._M_unused._M_object = local_38;
  local_ed0 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/optimization-options.h:134:12)>
              ::_M_invoke;
  local_ed8 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/optimization-options.h:134:12)>
              ::_M_manager;
  psVar1 = (string *)
           ::wasm::Options::add
                     (psVar1,local_b08,local_ae8,local_ac8,(Arguments)local_aa8,(function *)0x0,
                      SUB81(&local_ee8,0));
  std::__cxx11::string::string<std::allocator<char>>(local_a88,"",&local_75);
  std::__cxx11::string::string<std::allocator<char>>(local_a68,"-Os",&local_74);
  std::__cxx11::string::string<std::allocator<char>>
            (local_a48,"execute default optimization passes, focusing on code size",&local_73);
  std::__cxx11::string::string<std::allocator<char>>(local_a28,"Optimization options",&local_72);
  local_ec8._8_8_ = 0;
  local_ec8._M_unused._M_object = local_38;
  local_eb0 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/optimization-options.h:144:12)>
              ::_M_invoke;
  local_eb8 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/optimization-options.h:144:12)>
              ::_M_manager;
  psVar1 = (string *)
           ::wasm::Options::add
                     (psVar1,local_a88,local_a68,local_a48,(Arguments)local_a28,(function *)0x0,
                      SUB81(&local_ec8,0));
  std::__cxx11::string::string<std::allocator<char>>(local_a08,"",&local_71);
  std::__cxx11::string::string<std::allocator<char>>(local_9e8,"-Oz",&local_70);
  std::__cxx11::string::string<std::allocator<char>>
            (local_9c8,"execute default optimization passes, super-focusing on code size",&local_6f)
  ;
  std::__cxx11::string::string<std::allocator<char>>(local_9a8,"Optimization options",&local_6e);
  local_ea8._8_8_ = 0;
  local_ea8._M_unused._M_object = local_38;
  local_e90 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/optimization-options.h:154:12)>
              ::_M_invoke;
  local_e98 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/optimization-options.h:154:12)>
              ::_M_manager;
  psVar1 = (string *)
           ::wasm::Options::add
                     (psVar1,local_a08,local_9e8,local_9c8,(Arguments)local_9a8,(function *)0x0,
                      SUB81(&local_ea8,0));
  std::__cxx11::string::string<std::allocator<char>>(local_988,"--optimize-level",&local_6d);
  std::__cxx11::string::string<std::allocator<char>>(local_968,"-ol",&local_6c);
  std::__cxx11::string::string<std::allocator<char>>
            (local_948,"How much to focus on optimizing code",&local_6b);
  std::__cxx11::string::string<std::allocator<char>>(local_928,"Optimization options",&local_6a);
  local_e88._8_8_ = 0;
  local_e88._M_unused._M_object = local_38;
  local_e70 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/optimization-options.h:164:12)>
              ::_M_invoke;
  local_e78 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/optimization-options.h:164:12)>
              ::_M_manager;
  psVar1 = (string *)
           ::wasm::Options::add
                     (psVar1,local_988,local_968,local_948,(Arguments)local_928,(function *)0x1,
                      SUB81(&local_e88,0));
  std::__cxx11::string::string<std::allocator<char>>(local_908,"--shrink-level",&local_69);
  std::__cxx11::string::string<std::allocator<char>>(local_8e8,"-s",&local_68);
  std::__cxx11::string::string<std::allocator<char>>
            (local_8c8,"How much to focus on shrinking code size",&local_67);
  std::__cxx11::string::string<std::allocator<char>>(local_8a8,"Optimization options",&local_66);
  local_e68._8_8_ = 0;
  local_e68._M_unused._M_object = local_38;
  local_e50 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/optimization-options.h:172:12)>
              ::_M_invoke;
  local_e58 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/optimization-options.h:172:12)>
              ::_M_manager;
  psVar1 = (string *)
           ::wasm::Options::add
                     (psVar1,local_908,local_8e8,local_8c8,(Arguments)local_8a8,(function *)0x1,
                      SUB81(&local_e68,0));
  std::__cxx11::string::string<std::allocator<char>>(local_888,"--debuginfo",&local_65);
  std::__cxx11::string::string<std::allocator<char>>(local_868,"-g",&local_64);
  std::__cxx11::string::string<std::allocator<char>>
            (local_848,"Emit names section in wasm binary (or full debuginfo in wast)",&local_63);
  std::__cxx11::string::string<std::allocator<char>>(local_828,"Optimization options",&local_62);
  local_e48._8_8_ = 0;
  local_e48._M_unused._M_object = local_38;
  local_e30 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/optimization-options.h:180:12)>
              ::_M_invoke;
  local_e38 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/optimization-options.h:180:12)>
              ::_M_manager;
  psVar1 = (string *)
           ::wasm::Options::add
                     (psVar1,local_888,local_868,local_848,(Arguments)local_828,(function *)0x0,
                      SUB81(&local_e48,0));
  std::__cxx11::string::string<std::allocator<char>>
            (local_808,"--always-inline-max-function-size",&local_61);
  std::__cxx11::string::string<std::allocator<char>>(local_7e8,"-aimfs",&local_60);
  std::__cxx11::to_string(&local_788,2);
  std::operator+(&local_7a8,"Max size of functions that are always inlined (default ",&local_788);
  std::operator+(&local_7c8,&local_7a8,", which is safe for use with -Os builds)");
  std::__cxx11::string::string<std::allocator<char>>(local_768,"Optimization options",&local_5f);
  local_e28._8_8_ = 0;
  local_e28._M_unused._M_object = local_38;
  local_e10 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/optimization-options.h:191:12)>
              ::_M_invoke;
  local_e18 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/optimization-options.h:191:12)>
              ::_M_manager;
  psVar1 = (string *)
           ::wasm::Options::add
                     (psVar1,local_808,local_7e8,(string *)&local_7c8,(Arguments)local_768,
                      (function *)0x1,SUB81(&local_e28,0));
  std::__cxx11::string::string<std::allocator<char>>
            (local_748,"--flexible-inline-max-function-size",&local_5e);
  std::__cxx11::string::string<std::allocator<char>>(local_728,"-fimfs",&local_5d);
  std::__cxx11::to_string(&local_6e8,0x14);
  std::operator+(&local_708,
                 "Max size of functions that are inlined when lightweight (no loops or function calls) when optimizing aggressively for speed (-O3). Default: "
                 ,&local_6e8);
  std::__cxx11::string::string<std::allocator<char>>(local_6c8,"Optimization options",&local_5c);
  local_e08._8_8_ = 0;
  local_e08._M_unused._M_object = local_38;
  local_df0 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/optimization-options.h:203:12)>
              ::_M_invoke;
  local_df8 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/optimization-options.h:203:12)>
              ::_M_manager;
  psVar1 = (string *)
           ::wasm::Options::add
                     (psVar1,local_748,local_728,(string *)&local_708,(Arguments)local_6c8,
                      (function *)0x1,SUB81(&local_e08,0));
  std::__cxx11::string::string<std::allocator<char>>
            (local_6a8,"--one-caller-inline-max-function-size",&local_5b);
  std::__cxx11::string::string<std::allocator<char>>(local_688,"-ocimfs",&local_5a);
  std::__cxx11::string::string<std::allocator<char>>
            (local_668,
             "Max size of functions that are inlined when there is only one caller (default -1, which means all such functions are inlined)"
             ,&local_59);
  std::__cxx11::string::string<std::allocator<char>>(local_648,"Optimization options",&local_58);
  local_de8._8_8_ = 0;
  local_de8._M_unused._M_object = local_38;
  local_dd0 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/optimization-options.h:213:12)>
              ::_M_invoke;
  local_dd8 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/optimization-options.h:213:12)>
              ::_M_manager;
  psVar1 = (string *)
           ::wasm::Options::add
                     (psVar1,local_6a8,local_688,local_668,(Arguments)local_648,(function *)0x1,
                      SUB81(&local_de8,0));
  std::__cxx11::string::string<std::allocator<char>>
            (local_628,"--inline-functions-with-loops",&local_57);
  std::__cxx11::string::string<std::allocator<char>>(local_608,"-ifwl",&local_56);
  std::__cxx11::string::string<std::allocator<char>>
            (local_5e8,"Allow inlining functions with loops",&local_55);
  std::__cxx11::string::string<std::allocator<char>>(local_5c8,"Optimization options",&local_54);
  local_dc8._8_8_ = 0;
  local_dc8._M_unused._M_object = local_38;
  local_db0 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/optimization-options.h:225:12)>
              ::_M_invoke;
  local_db8 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/optimization-options.h:225:12)>
              ::_M_manager;
  psVar1 = (string *)
           ::wasm::Options::add
                     (psVar1,local_628,local_608,local_5e8,(Arguments)local_5c8,(function *)0x0,
                      SUB81(&local_dc8,0));
  std::__cxx11::string::string<std::allocator<char>>(local_5a8,"--partial-inlining-ifs",&local_53);
  std::__cxx11::string::string<std::allocator<char>>(local_588,"-pii",&local_52);
  std::__cxx11::to_string(&local_528,0);
  std::operator+(&local_548,
                 "Number of ifs allowed in partial inlining (zero means partial inlining is disabled) (default: "
                 ,&local_528);
  std::operator+(&local_568,&local_548,')');
  std::__cxx11::string::string<std::allocator<char>>(local_508,"Optimization options",&local_51);
  local_da8._8_8_ = 0;
  local_da8._M_unused._M_object = local_38;
  local_d90 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/optimization-options.h:235:12)>
              ::_M_invoke;
  local_d98 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/optimization-options.h:235:12)>
              ::_M_manager;
  psVar1 = (string *)
           ::wasm::Options::add
                     (psVar1,local_5a8,local_588,(string *)&local_568,(Arguments)local_508,
                      (function *)0x1,SUB81(&local_da8,0));
  std::__cxx11::string::string<std::allocator<char>>(local_4e8,"--ignore-implicit-traps",&local_50);
  std::__cxx11::string::string<std::allocator<char>>(local_4c8,"-iit",&local_4f);
  std::__cxx11::string::string<std::allocator<char>>
            (local_4a8,
             "Optimize under the helpful assumption that no surprising traps occur (from load, div/mod, etc.)"
             ,&local_4e);
  std::__cxx11::string::string<std::allocator<char>>(local_488,"Optimization options",&local_4d);
  local_d88._8_8_ = 0;
  local_d88._M_unused._M_object = local_38;
  local_d70 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/optimization-options.h:245:12)>
              ::_M_invoke;
  local_d78 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/optimization-options.h:245:12)>
              ::_M_manager;
  psVar1 = (string *)
           ::wasm::Options::add
                     (psVar1,local_4e8,local_4c8,local_4a8,(Arguments)local_488,(function *)0x0,
                      SUB81(&local_d88,0));
  std::__cxx11::string::string<std::allocator<char>>(local_468,"--traps-never-happen",&local_4c);
  std::__cxx11::string::string<std::allocator<char>>(local_448,"-tnh",&local_4b);
  std::__cxx11::string::string<std::allocator<char>>
            (local_428,
             "Optimize under the helpful assumption that no trap is reached at runtime (from load, div/mod, etc.)"
             ,&local_4a);
  std::__cxx11::string::string<std::allocator<char>>(local_408,"Optimization options",&local_49);
  local_d68._8_8_ = 0;
  local_d68._M_unused._M_object = local_38;
  local_d50 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/optimization-options.h:254:12)>
              ::_M_invoke;
  local_d58 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/optimization-options.h:254:12)>
              ::_M_manager;
  psVar1 = (string *)
           ::wasm::Options::add
                     (psVar1,local_468,local_448,local_428,(Arguments)local_408,(function *)0x0,
                      SUB81(&local_d68,0));
  std::__cxx11::string::string<std::allocator<char>>(local_3e8,"--low-memory-unused",&local_48);
  std::__cxx11::string::string<std::allocator<char>>(local_3c8,"-lmu",&local_47);
  std::__cxx11::string::string<std::allocator<char>>
            (local_3a8,
             "Optimize under the helpful assumption that the low 1K of memory is not used by the application"
             ,&local_46);
  std::__cxx11::string::string<std::allocator<char>>(local_388,"Optimization options",&local_45);
  local_d48._8_8_ = 0;
  local_d48._M_unused._M_object = local_38;
  local_d30 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/optimization-options.h:263:12)>
              ::_M_invoke;
  local_d38 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/optimization-options.h:263:12)>
              ::_M_manager;
  psVar1 = (string *)
           ::wasm::Options::add
                     (psVar1,local_3e8,local_3c8,local_3a8,(Arguments)local_388,(function *)0x0,
                      SUB81(&local_d48,0));
  std::__cxx11::string::string<std::allocator<char>>(local_368,"--fast-math",&local_44);
  std::__cxx11::string::string<std::allocator<char>>(local_348,"-ffm",&local_43);
  std::__cxx11::string::string<std::allocator<char>>
            (local_328,"Optimize floats without handling corner cases of NaNs and rounding",
             &local_42);
  std::__cxx11::string::string<std::allocator<char>>(local_308,"Optimization options",&local_41);
  local_d28._8_8_ = 0;
  local_d28._M_unused._M_object = local_38;
  local_d10 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/optimization-options.h:272:9)>
              ::_M_invoke;
  local_d18 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/optimization-options.h:272:9)>
              ::_M_manager;
  psVar1 = (string *)
           ::wasm::Options::add
                     (psVar1,local_368,local_348,local_328,(Arguments)local_308,(function *)0x0,
                      SUB81(&local_d28,0));
  std::__cxx11::string::string<std::allocator<char>>(local_2e8,"--zero-filled-memory",&local_40);
  std::__cxx11::string::string<std::allocator<char>>(local_2c8,"-uim",&local_3f);
  std::__cxx11::string::string<std::allocator<char>>
            (local_2a8,"Assume that an imported memory will be zero-initialized",&local_3e);
  std::__cxx11::string::string<std::allocator<char>>(local_288,"Optimization options",&local_3d);
  local_d08._8_8_ = 0;
  local_d08._M_unused._M_object = local_38;
  local_cf0 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/optimization-options.h:278:12)>
              ::_M_invoke;
  local_cf8 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/optimization-options.h:278:12)>
              ::_M_manager;
  psVar1 = (string *)
           ::wasm::Options::add
                     (psVar1,local_2e8,local_2c8,local_2a8,(Arguments)local_288,(function *)0x0,
                      SUB81(&local_d08,0));
  std::__cxx11::string::string<std::allocator<char>>(local_268,"--skip-pass",&local_3c);
  std::__cxx11::string::string<std::allocator<char>>(local_248,"-sp",&local_3b);
  std::__cxx11::string::string<std::allocator<char>>
            (local_228,"Skip a pass (do not run it)",&local_3a);
  std::__cxx11::string::string<std::allocator<char>>(local_208,"Optimization options",&local_39);
  local_ce8._8_8_ = 0;
  local_ce8._M_unused._M_object = local_38;
  local_cd0 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/optimization-options.h:286:12)>
              ::_M_invoke;
  local_cd8 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/optimization-options.h:286:12)>
              ::_M_manager;
  ::wasm::Options::add
            (psVar1,local_268,local_248,local_228,(Arguments)local_208,(function *)0x1,
             SUB81(&local_ce8,0));
  std::_Function_base::~_Function_base((_Function_base *)&local_ce8);
  std::__cxx11::string::~string(local_208);
  std::__cxx11::string::~string(local_228);
  std::__cxx11::string::~string(local_248);
  std::__cxx11::string::~string(local_268);
  std::_Function_base::~_Function_base((_Function_base *)&local_d08);
  std::__cxx11::string::~string(local_288);
  std::__cxx11::string::~string(local_2a8);
  std::__cxx11::string::~string(local_2c8);
  std::__cxx11::string::~string(local_2e8);
  std::_Function_base::~_Function_base((_Function_base *)&local_d28);
  std::__cxx11::string::~string(local_308);
  std::__cxx11::string::~string(local_328);
  std::__cxx11::string::~string(local_348);
  std::__cxx11::string::~string(local_368);
  std::_Function_base::~_Function_base((_Function_base *)&local_d48);
  std::__cxx11::string::~string(local_388);
  std::__cxx11::string::~string(local_3a8);
  std::__cxx11::string::~string(local_3c8);
  std::__cxx11::string::~string(local_3e8);
  std::_Function_base::~_Function_base((_Function_base *)&local_d68);
  std::__cxx11::string::~string(local_408);
  std::__cxx11::string::~string(local_428);
  std::__cxx11::string::~string(local_448);
  std::__cxx11::string::~string(local_468);
  std::_Function_base::~_Function_base((_Function_base *)&local_d88);
  std::__cxx11::string::~string(local_488);
  std::__cxx11::string::~string(local_4a8);
  std::__cxx11::string::~string(local_4c8);
  std::__cxx11::string::~string(local_4e8);
  std::_Function_base::~_Function_base((_Function_base *)&local_da8);
  std::__cxx11::string::~string(local_508);
  std::__cxx11::string::~string((string *)&local_568);
  std::__cxx11::string::~string((string *)&local_548);
  std::__cxx11::string::~string((string *)&local_528);
  std::__cxx11::string::~string(local_588);
  std::__cxx11::string::~string(local_5a8);
  std::_Function_base::~_Function_base((_Function_base *)&local_dc8);
  std::__cxx11::string::~string(local_5c8);
  std::__cxx11::string::~string(local_5e8);
  std::__cxx11::string::~string(local_608);
  std::__cxx11::string::~string(local_628);
  std::_Function_base::~_Function_base((_Function_base *)&local_de8);
  std::__cxx11::string::~string(local_648);
  std::__cxx11::string::~string(local_668);
  std::__cxx11::string::~string(local_688);
  std::__cxx11::string::~string(local_6a8);
  std::_Function_base::~_Function_base((_Function_base *)&local_e08);
  std::__cxx11::string::~string(local_6c8);
  std::__cxx11::string::~string((string *)&local_708);
  std::__cxx11::string::~string((string *)&local_6e8);
  std::__cxx11::string::~string(local_728);
  std::__cxx11::string::~string(local_748);
  std::_Function_base::~_Function_base((_Function_base *)&local_e28);
  std::__cxx11::string::~string(local_768);
  std::__cxx11::string::~string((string *)&local_7c8);
  std::__cxx11::string::~string((string *)&local_7a8);
  std::__cxx11::string::~string((string *)&local_788);
  std::__cxx11::string::~string(local_7e8);
  std::__cxx11::string::~string(local_808);
  std::_Function_base::~_Function_base((_Function_base *)&local_e48);
  std::__cxx11::string::~string(local_828);
  std::__cxx11::string::~string(local_848);
  std::__cxx11::string::~string(local_868);
  std::__cxx11::string::~string(local_888);
  std::_Function_base::~_Function_base((_Function_base *)&local_e68);
  std::__cxx11::string::~string(local_8a8);
  std::__cxx11::string::~string(local_8c8);
  std::__cxx11::string::~string(local_8e8);
  std::__cxx11::string::~string(local_908);
  std::_Function_base::~_Function_base((_Function_base *)&local_e88);
  std::__cxx11::string::~string(local_928);
  std::__cxx11::string::~string(local_948);
  std::__cxx11::string::~string(local_968);
  std::__cxx11::string::~string(local_988);
  std::_Function_base::~_Function_base((_Function_base *)&local_ea8);
  std::__cxx11::string::~string(local_9a8);
  std::__cxx11::string::~string(local_9c8);
  std::__cxx11::string::~string(local_9e8);
  std::__cxx11::string::~string(local_a08);
  std::_Function_base::~_Function_base((_Function_base *)&local_ec8);
  std::__cxx11::string::~string(local_a28);
  std::__cxx11::string::~string(local_a48);
  std::__cxx11::string::~string(local_a68);
  std::__cxx11::string::~string(local_a88);
  std::_Function_base::~_Function_base((_Function_base *)&local_ee8);
  std::__cxx11::string::~string(local_aa8);
  std::__cxx11::string::~string(local_ac8);
  std::__cxx11::string::~string(local_ae8);
  std::__cxx11::string::~string(local_b08);
  std::_Function_base::~_Function_base((_Function_base *)&local_f08);
  std::__cxx11::string::~string(local_b28);
  std::__cxx11::string::~string(local_b48);
  std::__cxx11::string::~string(local_b68);
  std::__cxx11::string::~string(local_b88);
  std::_Function_base::~_Function_base((_Function_base *)&local_f28);
  std::__cxx11::string::~string(local_ba8);
  std::__cxx11::string::~string(local_bc8);
  std::__cxx11::string::~string(local_be8);
  std::__cxx11::string::~string(local_c08);
  std::_Function_base::~_Function_base((_Function_base *)&local_f48);
  std::__cxx11::string::~string(local_c28);
  std::__cxx11::string::~string(local_c48);
  std::__cxx11::string::~string(local_c68);
  std::__cxx11::string::~string(local_1c8);
  std::_Function_base::~_Function_base((_Function_base *)&local_c88);
  std::__cxx11::string::~string(local_1e8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string(local_128);
  std::_Function_base::~_Function_base((_Function_base *)&local_1a8);
  std::__cxx11::string::~string(local_148);
  std::__cxx11::string::~string((string *)&local_168);
  std::__cxx11::string::~string((string *)&local_188);
  std::__cxx11::string::~string((string *)local_e8);
  ::wasm::PassRegistry::get();
  ::wasm::PassRegistry::getRegisteredNames_abi_cxx11_();
  local_c0 = local_b8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  while (local_98 = local_b8.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
        local_b8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != local_c0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_168,"--",(allocator<char> *)local_1e8);
    std::operator+(&local_188,&local_168,local_98);
    std::__cxx11::string::string<std::allocator<char>>
              (local_148,"",(allocator<char> *)local_c88._M_pod_data);
    uVar2 = ::wasm::PassRegistry::get();
    std::__cxx11::string::string(local_cc8,(string *)local_98);
    ::wasm::PassRegistry::getPassDescription(&local_1a8,uVar2,local_cc8);
    std::__cxx11::string::string<std::allocator<char>>
              (local_128,"Optimization passes",(allocator<char> *)local_1c8);
    local_e8._0_8_ = local_38;
    std::__cxx11::string::string((string *)(local_e8 + 8),(string *)local_98);
    std::function<void(wasm::Options*,std::__cxx11::string_const&)>::
    function<wasm::OptimizationOptions::OptimizationOptions(std::__cxx11::string_const&,std::__cxx11::string_const&)::_lambda(wasm::Options*,std::__cxx11::string_const&)_23_,void>
              ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_108,
               (anon_class_40_2_fd512ddd *)local_e8);
    uVar2 = ::wasm::PassRegistry::get();
    std::__cxx11::string::string(local_ca8,(string *)local_98);
    ::wasm::PassRegistry::isPassHidden(uVar2,local_ca8);
    ::wasm::Options::add
              ((string *)local_38,(string *)&local_188,local_148,(string *)local_1a8._M_pod_data,
               (Arguments)local_128,(function *)0x3,SUB81(&local_108,0));
    std::__cxx11::string::~string(local_ca8);
    std::_Function_base::~_Function_base(&local_108);
    std::__cxx11::string::~string((string *)(local_e8 + 8));
    std::__cxx11::string::~string(local_128);
    std::__cxx11::string::~string((string *)local_1a8._M_pod_data);
    std::__cxx11::string::~string(local_cc8);
    std::__cxx11::string::~string(local_148);
    std::__cxx11::string::~string((string *)&local_188);
    std::__cxx11::string::~string((string *)&local_168);
    local_b8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = local_98 + 1;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_b8);
  return;
}

Assistant:

OptimizationOptions(const std::string& command,
                      const std::string& description)
    : ToolOptions(command, description) {
    (*this)
      .add(
        "",
        "-O",
        "execute default optimization passes (equivalent to -Os)",
        OptimizationOptionsCategory,
        Options::Arguments::Zero,
        [this](Options*, const std::string&) {
          passOptions.setDefaultOptimizationOptions();
          static_assert(
            PassOptions::DEFAULT_OPTIMIZE_LEVEL == OS_OPTIMIZE_LEVEL &&
              PassOptions::DEFAULT_SHRINK_LEVEL == OS_SHRINK_LEVEL,
            "Help text states that -O is equivalent to -Os but now it isn't.");
          addDefaultOptPasses();
        })
      .add("",
           "-O0",
           "execute no optimization passes",
           OptimizationOptionsCategory,
           Options::Arguments::Zero,
           [this](Options*, const std::string&) {
             passOptions.optimizeLevel = 0;
             passOptions.shrinkLevel = 0;
           })
      .add("",
           "-O1",
           "execute -O1 optimization passes (quick&useful opts, useful for "
           "iteration builds)",
           OptimizationOptionsCategory,
           Options::Arguments::Zero,
           [this](Options*, const std::string&) {
             passOptions.optimizeLevel = 1;
             passOptions.shrinkLevel = 0;
             addDefaultOptPasses();
           })
      .add(
        "",
        "-O2",
        "execute -O2 optimization passes (most opts, generally gets most perf)",
        OptimizationOptionsCategory,
        Options::Arguments::Zero,
        [this](Options*, const std::string&) {
          passOptions.optimizeLevel = 2;
          passOptions.shrinkLevel = 0;
          addDefaultOptPasses();
        })
      .add("",
           "-O3",
           "execute -O3 optimization passes (spends potentially a lot of time "
           "optimizing)",
           OptimizationOptionsCategory,
           Options::Arguments::Zero,
           [this](Options*, const std::string&) {
             passOptions.optimizeLevel = 3;
             passOptions.shrinkLevel = 0;
             addDefaultOptPasses();
           })
      .add("",
           "-O4",
           "execute -O4 optimization passes (also flatten the IR, which can "
           "take a lot more time and memory, but is useful on more nested / "
           "complex / less-optimized input)",
           OptimizationOptionsCategory,
           Options::Arguments::Zero,
           [this](Options*, const std::string&) {
             passOptions.optimizeLevel = 4;
             passOptions.shrinkLevel = 0;
             addDefaultOptPasses();
           })
      .add("",
           "-Os",
           "execute default optimization passes, focusing on code size",
           OptimizationOptionsCategory,
           Options::Arguments::Zero,
           [this](Options*, const std::string&) {
             passOptions.optimizeLevel = OS_OPTIMIZE_LEVEL;
             passOptions.shrinkLevel = OS_SHRINK_LEVEL;
             addDefaultOptPasses();
           })
      .add("",
           "-Oz",
           "execute default optimization passes, super-focusing on code size",
           OptimizationOptionsCategory,
           Options::Arguments::Zero,
           [this](Options*, const std::string&) {
             passOptions.optimizeLevel = 2;
             passOptions.shrinkLevel = 2;
             addDefaultOptPasses();
           })
      .add("--optimize-level",
           "-ol",
           "How much to focus on optimizing code",
           OptimizationOptionsCategory,
           Options::Arguments::One,
           [this](Options* o, const std::string& argument) {
             passOptions.optimizeLevel = atoi(argument.c_str());
           })
      .add("--shrink-level",
           "-s",
           "How much to focus on shrinking code size",
           OptimizationOptionsCategory,
           Options::Arguments::One,
           [this](Options* o, const std::string& argument) {
             passOptions.shrinkLevel = atoi(argument.c_str());
           })
      .add("--debuginfo",
           "-g",
           "Emit names section in wasm binary (or full debuginfo in wast)",
           OptimizationOptionsCategory,
           Options::Arguments::Zero,
           [&](Options* o, const std::string& arguments) {
             passOptions.debugInfo = true;
           })
      .add("--always-inline-max-function-size",
           "-aimfs",
           "Max size of functions that are always inlined (default " +
             std::to_string(InliningOptions().alwaysInlineMaxSize) +
             ", which "
             "is safe for use with -Os builds)",
           OptimizationOptionsCategory,
           Options::Arguments::One,
           [this](Options* o, const std::string& argument) {
             passOptions.inlining.alwaysInlineMaxSize =
               static_cast<Index>(atoi(argument.c_str()));
           })
      .add("--flexible-inline-max-function-size",
           "-fimfs",
           "Max size of functions that are inlined when lightweight (no loops "
           "or function calls) when optimizing aggressively for speed (-O3). "
           "Default: " +
             std::to_string(InliningOptions().flexibleInlineMaxSize),
           OptimizationOptionsCategory,
           Options::Arguments::One,
           [this](Options* o, const std::string& argument) {
             passOptions.inlining.flexibleInlineMaxSize =
               static_cast<Index>(atoi(argument.c_str()));
           })
      .add("--one-caller-inline-max-function-size",
           "-ocimfs",
           "Max size of functions that are inlined when there is only one "
           "caller (default -1, which means all such functions are inlined)",
           OptimizationOptionsCategory,
           Options::Arguments::One,
           [this](Options* o, const std::string& argument) {
             static_assert(InliningOptions().oneCallerInlineMaxSize ==
                             Index(-1),
                           "the help text here is written to assume -1");
             passOptions.inlining.oneCallerInlineMaxSize =
               static_cast<Index>(atoi(argument.c_str()));
           })
      .add("--inline-functions-with-loops",
           "-ifwl",
           "Allow inlining functions with loops",
           OptimizationOptionsCategory,
           Options::Arguments::Zero,
           [this](Options* o, const std::string&) {
             passOptions.inlining.allowFunctionsWithLoops = true;
           })
      .add("--partial-inlining-ifs",
           "-pii",
           "Number of ifs allowed in partial inlining (zero means partial "
           "inlining is disabled) (default: " +
             std::to_string(InliningOptions().partialInliningIfs) + ')',
           OptimizationOptionsCategory,
           Options::Arguments::One,
           [this](Options* o, const std::string& argument) {
             passOptions.inlining.partialInliningIfs =
               static_cast<Index>(std::stoi(argument));
           })
      .add("--ignore-implicit-traps",
           "-iit",
           "Optimize under the helpful assumption that no surprising traps "
           "occur (from load, div/mod, etc.)",
           OptimizationOptionsCategory,
           Options::Arguments::Zero,
           [this](Options*, const std::string&) {
             passOptions.ignoreImplicitTraps = true;
           })
      .add("--traps-never-happen",
           "-tnh",
           "Optimize under the helpful assumption that no trap is reached at "
           "runtime (from load, div/mod, etc.)",
           OptimizationOptionsCategory,
           Options::Arguments::Zero,
           [this](Options*, const std::string&) {
             passOptions.trapsNeverHappen = true;
           })
      .add("--low-memory-unused",
           "-lmu",
           "Optimize under the helpful assumption that the low 1K of memory is "
           "not used by the application",
           OptimizationOptionsCategory,
           Options::Arguments::Zero,
           [this](Options*, const std::string&) {
             passOptions.lowMemoryUnused = true;
           })
      .add(
        "--fast-math",
        "-ffm",
        "Optimize floats without handling corner cases of NaNs and rounding",
        OptimizationOptionsCategory,
        Options::Arguments::Zero,
        [this](Options*, const std::string&) { passOptions.fastMath = true; })
      .add("--zero-filled-memory",
           "-uim",
           "Assume that an imported memory will be zero-initialized",
           OptimizationOptionsCategory,
           Options::Arguments::Zero,
           [this](Options*, const std::string&) {
             passOptions.zeroFilledMemory = true;
           })
      .add("--skip-pass",
           "-sp",
           "Skip a pass (do not run it)",
           OptimizationOptionsCategory,
           Options::Arguments::One,
           [this](Options*, const std::string& pass) {
             passOptions.passesToSkip.insert(pass);
           });

    // add passes in registry
    for (const auto& p : PassRegistry::get()->getRegisteredNames()) {
      (*this).add(
        std::string("--") + p,
        "",
        PassRegistry::get()->getPassDescription(p),
        "Optimization passes",
        // Allow an optional parameter to a pass. If provided, it is
        // the same as if using --pass-arg, that is,
        //
        //   --foo=ARG
        //
        // is the same as
        //
        //   --foo --pass-arg=foo@ARG
        Options::Arguments::Optional,
        [this, p](Options*, const std::string& arg) {
          if (!arg.empty()) {
            if (passOptions.arguments.count(p)) {
              Fatal() << "Cannot pass multiple pass arguments to " << p;
            }
            passOptions.arguments[p] = arg;
          }
          passes.push_back(p);
        },
        PassRegistry::get()->isPassHidden(p));
    }
  }